

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef lj_record_constify(jit_State *J,cTValue *o)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  GCobj *in_RSI;
  jit_State *in_RDI;
  lua_Number in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  TRef local_34;
  uint local_24;
  uint local_14;
  
  if (*(int *)&(in_RSI->gch).marked + 4U < 0xfffffff7) {
    uVar1._0_1_ = *(uint8_t *)((long)in_RSI + 4);
    uVar1._1_1_ = *(uint8_t *)((long)in_RSI + 5);
    uVar1._2_1_ = *(uint8_t *)((long)in_RSI + 6);
    uVar1._3_1_ = *(uint8_t *)((long)in_RSI + 7);
    if (uVar1 < 0xfffeffff) {
      local_34 = lj_ir_knumint((jit_State *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98);
    }
    else {
      iVar2._0_1_ = *(uint8_t *)((long)in_RSI + 4);
      iVar2._1_1_ = *(uint8_t *)((long)in_RSI + 5);
      iVar2._2_1_ = *(uint8_t *)((long)in_RSI + 6);
      iVar2._3_1_ = *(uint8_t *)((long)in_RSI + 7);
      if ((iVar2 == -2) ||
         (iVar3._0_1_ = *(uint8_t *)((long)in_RSI + 4), iVar3._1_1_ = *(uint8_t *)((long)in_RSI + 5)
         , iVar3._2_1_ = *(uint8_t *)((long)in_RSI + 6),
         iVar3._3_1_ = *(uint8_t *)((long)in_RSI + 7), iVar3 == -3)) {
        uVar4._0_1_ = *(uint8_t *)((long)in_RSI + 4);
        uVar4._1_1_ = *(uint8_t *)((long)in_RSI + 5);
        uVar4._2_1_ = *(uint8_t *)((long)in_RSI + 6);
        uVar4._3_1_ = *(uint8_t *)((long)in_RSI + 7);
        if (uVar4 < 0xfffeffff) {
          local_14 = 0xe;
        }
        else {
          iVar5._0_1_ = *(uint8_t *)((long)in_RSI + 4);
          iVar5._1_1_ = *(uint8_t *)((long)in_RSI + 5);
          iVar5._2_1_ = *(uint8_t *)((long)in_RSI + 6);
          iVar5._3_1_ = *(uint8_t *)((long)in_RSI + 7);
          if (iVar5 >> 0xf == -2) {
            local_14 = 3;
          }
          else {
            local_14._0_1_ = *(uint8_t *)((long)in_RSI + 4);
            local_14._1_1_ = *(uint8_t *)((long)in_RSI + 5);
            local_14._2_1_ = *(uint8_t *)((long)in_RSI + 6);
            local_14._3_1_ = *(uint8_t *)((long)in_RSI + 7);
            local_14 = local_14 ^ 0xffffffff;
          }
        }
        uVar6._0_1_ = *(uint8_t *)((long)in_RSI + 4);
        uVar6._1_1_ = *(uint8_t *)((long)in_RSI + 5);
        uVar6._2_1_ = *(uint8_t *)((long)in_RSI + 6);
        uVar6._3_1_ = *(uint8_t *)((long)in_RSI + 7);
        if (uVar6 < 0xfffeffff) {
          local_24 = 0xe;
        }
        else {
          iVar7._0_1_ = *(uint8_t *)((long)in_RSI + 4);
          iVar7._1_1_ = *(uint8_t *)((long)in_RSI + 5);
          iVar7._2_1_ = *(uint8_t *)((long)in_RSI + 6);
          iVar7._3_1_ = *(uint8_t *)((long)in_RSI + 7);
          if (iVar7 >> 0xf == -2) {
            local_24 = 3;
          }
          else {
            local_24._0_1_ = *(uint8_t *)((long)in_RSI + 4);
            local_24._1_1_ = *(uint8_t *)((long)in_RSI + 5);
            local_24._2_1_ = *(uint8_t *)((long)in_RSI + 6);
            local_24._3_1_ = *(uint8_t *)((long)in_RSI + 7);
            local_24 = local_24 ^ 0xffffffff;
          }
        }
        local_34 = (0x7fff - local_14) + local_24 * 0x1000000;
      }
      else {
        local_34 = 0;
      }
    }
  }
  else {
    local_34 = lj_ir_kgc(in_RDI,in_RSI,IRT_NIL);
  }
  return local_34;
}

Assistant:

TRef lj_record_constify(jit_State *J, cTValue *o)
{
  if (tvisgcv(o))
    return lj_ir_kgc(J, gcV(o), itype2irt(o));
  else if (tvisint(o))
    return lj_ir_kint(J, intV(o));
  else if (tvisnum(o))
    return lj_ir_knumint(J, numV(o));
  else if (tvisbool(o))
    return TREF_PRI(itype2irt(o));
  else
    return 0;  /* Can't represent lightuserdata (pointless). */
}